

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O0

char * ps_config_str(cmd_ln_t *config,char *name)

{
  cmd_ln_val_t *pcVar1;
  cmd_ln_val_t *val;
  char *name_local;
  cmd_ln_t *config_local;
  
  pcVar1 = cmd_ln_access_r(config,name);
  if (pcVar1 == (cmd_ln_val_t *)0x0) {
    config_local = (cmd_ln_t *)0x0;
  }
  else if ((pcVar1->type & 8U) == 0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
            ,0x25d,"Argument %s does not have string type\n",name);
    config_local = (cmd_ln_t *)0x0;
  }
  else {
    config_local = (cmd_ln_t *)(pcVar1->val).ptr;
  }
  return (char *)config_local;
}

Assistant:

char const *
ps_config_str(cmd_ln_t *config, char const *name)
{
    cmd_ln_val_t *val;
    val = cmd_ln_access_r(config, name);
    if (val == NULL)
        return NULL;
    if (!(val->type & ARG_STRING)) {
        E_ERROR("Argument %s does not have string type\n", name);
        return NULL;
    }
    return (char const *)val->val.ptr;
}